

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O1

stumpless_element * stumpless_get_element_by_index(stumpless_entry *entry,size_t index)

{
  stumpless_element *psVar1;
  
  if (entry == (stumpless_entry *)0x0) {
    raise_argument_empty("entry was NULL");
  }
  else {
    if (index < entry->element_count) {
      clear_error();
      pthread_lock_mutex((pthread_mutex_t *)entry->mutex);
      if (index < entry->element_count) {
        psVar1 = entry->elements[index];
      }
      else {
        raise_index_out_of_bounds("invalid element index",index);
        psVar1 = (stumpless_element *)0x0;
      }
      pthread_unlock_mutex((pthread_mutex_t *)entry->mutex);
      return psVar1;
    }
    raise_index_out_of_bounds("invalid element index",index);
  }
  return (stumpless_element *)0x0;
}

Assistant:

struct stumpless_element *
stumpless_get_element_by_index( const struct stumpless_entry *entry,
                                size_t index ) {
  struct stumpless_element *result;

  VALIDATE_ARG_NOT_NULL( entry );

  if( index >= entry->element_count ) {
    raise_index_out_of_bounds( L10N_INVALID_INDEX_ERROR_MESSAGE( "element" ),
                               index );
    return NULL;
  }

  clear_error(  );

  lock_entry( entry );
  result = locked_get_element_by_index( entry, index );
  unlock_entry( entry );

  return result;
}